

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

void * tlb_vaddr_to_host_m68k
                 (CPUArchState_conflict3 *env,abi_ptr_conflict addr,MMUAccessType access_type,
                 int mmu_idx)

{
  bool bVar1;
  _Bool _Var2;
  char cVar3;
  uint uVar4;
  size_t mmu_idx_00;
  uint uVar5;
  long lVar6;
  size_t elt_ofs;
  CPUM68KState_conflict *__mptr;
  
  if (MMU_INST_FETCH < access_type) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
               ,0x4f9,(char *)0x0);
  }
  mmu_idx_00 = (size_t)mmu_idx;
  uVar4 = env->dregs[mmu_idx_00 * 4 + -0xc] >> 6 & addr >> 0xc;
  lVar6 = (ulong)(uVar4 << 6) + *(long *)(env->dregs + mmu_idx_00 * 4 + -10);
  uVar5 = *(uint *)(lVar6 + (ulong)access_type * 4);
  if ((uVar5 & 0xfffff800) == (addr & 0xfffff000)) goto LAB_006e3a64;
  elt_ofs = (ulong)access_type * 4;
  _Var2 = victim_tlb_hit(env,mmu_idx_00,(ulong)uVar4,elt_ofs,addr & 0xfffff000);
  if (_Var2) {
LAB_006e3a56:
    uVar5 = *(uint *)(elt_ofs + lVar6);
    bVar1 = true;
  }
  else {
    cVar3 = (**(code **)(env[-3].fregs[3].d.low + 0x48))
                      (env[-0x40].fregs + 2,addr,0,access_type,mmu_idx,1,0);
    if (cVar3 != '\0') {
      lVar6 = (ulong)((addr >> 0xc & env->dregs[mmu_idx_00 * 4 + -0xc] >> 6) << 6) +
              *(long *)(env->dregs + mmu_idx_00 * 4 + -10);
      goto LAB_006e3a56;
    }
    bVar1 = false;
  }
  if (!bVar1) {
    return (void *)0x0;
  }
LAB_006e3a64:
  if ((uVar5 & 0xfff) != 0) {
    return (void *)0x0;
  }
  return (void *)((ulong)addr + *(long *)(lVar6 + 0x10));
}

Assistant:

void *tlb_vaddr_to_host(CPUArchState *env, abi_ptr addr,
                        MMUAccessType access_type, int mmu_idx)
{
    struct uc_struct *uc = env->uc;
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    target_ulong tlb_addr, page;
    size_t elt_ofs = 0;

    switch (access_type) {
    case MMU_DATA_LOAD:
        elt_ofs = offsetof(CPUTLBEntry, addr_read);
        break;
    case MMU_DATA_STORE:
        elt_ofs = offsetof(CPUTLBEntry, addr_write);
        break;
    case MMU_INST_FETCH:
        elt_ofs = offsetof(CPUTLBEntry, addr_code);
        break;
    default:
        g_assert_not_reached();
    }

    page = addr & TARGET_PAGE_MASK;
    tlb_addr = tlb_read_ofs(entry, elt_ofs);

    if (!tlb_hit_page(uc, tlb_addr, page)) {
        uintptr_t index = tlb_index(env, mmu_idx, addr);

        if (!victim_tlb_hit(env, mmu_idx, index, elt_ofs, page)) {
            CPUState *cs = env_cpu(env);
            CPUClass *cc = CPU_GET_CLASS(cs);

            if (!cc->tlb_fill(cs, addr, 0, access_type, mmu_idx, true, 0)) {
                /* Non-faulting page table read failed.  */
                return NULL;
            }

            /* TLB resize via tlb_fill may have moved the entry.  */
            entry = tlb_entry(env, mmu_idx, addr);
        }
        tlb_addr = tlb_read_ofs(entry, elt_ofs);
    }

    if (tlb_addr & ~TARGET_PAGE_MASK) {
        /* IO access */
        return NULL;
    }

    return (void *)((uintptr_t)addr + entry->addend);
}